

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

void __thiscall
Js::CharArray::SortHelper
          (CharArray *this,byte *listBuffer,uint32 length,RecyclableObject *compareFn,
          ScriptContext *scriptContext,ArenaAllocator *allocator)

{
  undefined1 local_58 [8];
  CompareVarsInfo cvInfo;
  char16 *list;
  ArenaAllocator *allocator_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *compareFn_local;
  uint32 length_local;
  byte *listBuffer_local;
  CharArray *this_local;
  
  cvInfo.compareType = (_func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *)listBuffer;
  Js::JavascriptArray::CompareVarsInfo::CompareVarsInfo((CompareVarsInfo *)local_58);
  local_58 = (undefined1  [8])scriptContext;
  Memory::WriteBarrierPtr<Js::RecyclableObject>::operator=
            ((WriteBarrierPtr<Js::RecyclableObject> *)&cvInfo,compareFn);
  cvInfo.compFn.ptr = (RecyclableObject *)TypedArrayCompareElementsHelper<char16_t>;
  Js::JavascriptArray::TypedArraySort<char16_t>
            ((char16_t *)cvInfo.compareType,length,(CompareVarsInfo *)local_58,allocator);
  return;
}

Assistant:

void SortHelper(byte* listBuffer, uint32 length, RecyclableObject* compareFn, ScriptContext* scriptContext, ArenaAllocator* allocator)
        {
            char16* list = reinterpret_cast<char16*>(listBuffer);
            JavascriptArray::CompareVarsInfo cvInfo;
            cvInfo.scriptContext = scriptContext;
            cvInfo.compFn = compareFn;
            cvInfo.compareType = &TypedArrayCompareElementsHelper<char16>;
            JavascriptArray::TypedArraySort<char16>(list, length, &cvInfo, allocator);
        }